

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test::
~CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test
          (CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test
            ((CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test *)0x28a418);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_SelectCoinsBnB_empty)
{
  // BnB fail. (use knapsack)
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(114040000);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)));
  EXPECT_EQ(select_utxos.size(), 3);
  EXPECT_EQ(select_value.GetSatoshiValue(), static_cast<int64_t>(115063590));
  EXPECT_EQ(fee_value.GetSatoshiValue(), static_cast<int64_t>(276));
  if (select_utxos.size() == 3) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(select_utxos[2].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_FALSE(use_bnb);
}